

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_window_show(nk_context *ctx,char *name,nk_show_states s)

{
  long lVar1;
  nk_hash hash;
  nk_window *pnVar2;
  long lVar3;
  
  if (ctx != (nk_context *)0x0) {
    lVar3 = 0;
    if ((name != (char *)0x0) && (*name != '\0')) {
      lVar3 = 0;
      do {
        lVar1 = lVar3 + 1;
        lVar3 = lVar3 + 1;
      } while (name[lVar1] != '\0');
    }
    hash = nk_murmur_hash(name,(int)lVar3,0x40);
    pnVar2 = nk_find_window(ctx,hash,name);
    if (pnVar2 != (nk_window *)0x0) {
      pnVar2->flags = (uint)(s == NK_HIDDEN) << 0xc | pnVar2->flags & 0xffffefff;
    }
  }
  return;
}

Assistant:

NK_API void
nk_window_show(struct nk_context *ctx, const char *name, enum nk_show_states s)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) return;
    if (s == NK_HIDDEN)
        win->flags |= NK_WINDOW_HIDDEN;
    else win->flags &= ~(nk_flags)NK_WINDOW_HIDDEN;
}